

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O1

UScriptCode uscript_getScript_63(UChar32 c,UErrorCode *pErrorCode)

{
  UScriptCode UVar1;
  UScriptCode UVar2;
  UScriptCode UVar3;
  
  UVar3 = USCRIPT_INVALID_CODE;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((uint)c < 0x110000) {
      UVar1 = u_getUnicodeProperties_63(c,0);
      UVar2 = UVar1 & 0xc000ff;
      UVar3 = UVar2;
      if (((0x3fffff < (uint)UVar2) && (UVar3 = USCRIPT_COMMON, 0x7fffff < (uint)UVar2)) &&
         (UVar3 = USCRIPT_INHERITED, 0xbfffff < (uint)UVar2)) {
        UVar3 = (uint)scriptExtensions
                      [(uint)(UVar1 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET))];
      }
    }
    else {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return UVar3;
}

Assistant:

U_CAPI UScriptCode U_EXPORT2
uscript_getScript(UChar32 c, UErrorCode *pErrorCode) {
    uint32_t scriptX;
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return USCRIPT_INVALID_CODE;
    }
    if((uint32_t)c>0x10ffff) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return USCRIPT_INVALID_CODE;
    }
    scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        return (UScriptCode)scriptX;
    } else if(scriptX<UPROPS_SCRIPT_X_WITH_INHERITED) {
        return USCRIPT_COMMON;
    } else if(scriptX<UPROPS_SCRIPT_X_WITH_OTHER) {
        return USCRIPT_INHERITED;
    } else {
        return (UScriptCode)scriptExtensions[scriptX&UPROPS_SCRIPT_MASK];
    }
}